

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O0

optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
 __thiscall
unodb::detail::
basic_inode_impl<unodb::detail::basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>>
::
add_or_choose_subtree<std::optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>>*>,std::byte,unodb::detail::basic_art_key<std::span<std::byte_const,18446744073709551615ul>>&,std::span<std::byte_const,18446744073709551615ul>&,unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>&,unodb::detail::tree_depth<unodb::detail::basic_art_key<std::span<std::byte_const,18446744073709551615ul>>>&,unodb::optimistic_lock::read_critical_section&,unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>>*&,unodb::optimistic_lock::read_critical_section&,std::unique_ptr<unodb::detail::basic_leaf<std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_node_header>,unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>>&>
          (basic_inode_impl<unodb::detail::basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>>
           *this,node_type type,byte *args,
          basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *args_1,
          span<const_std::byte,_18446744073709551615UL> *args_2,
          olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          *args_3,tree_depth<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_>
                  *args_4,read_critical_section *args_5,
          in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
          **args_6,read_critical_section *args_7,
          unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
          *args_8)

{
  _Optional_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true>
  _Var1;
  optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
  oVar2;
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *args_local_3;
  span<const_std::byte,_18446744073709551615UL> *args_local_2;
  basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *args_local_1;
  byte *args_local;
  node_type type_local;
  basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
  *this_local;
  undefined1 local_18;
  
  switch(type) {
  case LEAF:
    cannot_happen("/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x366,"add_or_choose_subtree");
  case I4:
    _Var1._M_payload.
    super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
         = (_Optional_payload<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true,_true>
            )olc_inode_4<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
             ::
             add_or_choose_subtree<std::byte,unodb::detail::basic_art_key<std::span<std::byte_const,18446744073709551615ul>>&,std::span<std::byte_const,18446744073709551615ul>&,unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>&,unodb::detail::tree_depth<unodb::detail::basic_art_key<std::span<std::byte_const,18446744073709551615ul>>>&,unodb::optimistic_lock::read_critical_section&,unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>>*&,unodb::optimistic_lock::read_critical_section&,std::unique_ptr<unodb::detail::basic_leaf<std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_node_header>,unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>>&>
                       ((olc_inode_4<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
                         *)this,args,args_1,args_2,args_3,args_4,args_5,args_6,args_7,args_8);
    local_18 = _Var1._M_payload.
               super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
               ._M_engaged;
    break;
  case I16:
    _Var1._M_payload.
    super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
         = (_Optional_payload<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true,_true>
            )olc_inode_16<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
             ::
             add_or_choose_subtree<std::byte,unodb::detail::basic_art_key<std::span<std::byte_const,18446744073709551615ul>>&,std::span<std::byte_const,18446744073709551615ul>&,unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>&,unodb::detail::tree_depth<unodb::detail::basic_art_key<std::span<std::byte_const,18446744073709551615ul>>>&,unodb::optimistic_lock::read_critical_section&,unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>>*&,unodb::optimistic_lock::read_critical_section&,std::unique_ptr<unodb::detail::basic_leaf<std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_node_header>,unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>>&>
                       ((olc_inode_16<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
                         *)this,args,args_1,args_2,args_3,args_4,args_5,args_6,args_7,args_8);
    local_18 = _Var1._M_payload.
               super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
               ._M_engaged;
    break;
  case I48:
    _Var1._M_payload.
    super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
         = (_Optional_payload<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true,_true>
            )olc_inode_48<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
             ::
             add_or_choose_subtree<std::byte,unodb::detail::basic_art_key<std::span<std::byte_const,18446744073709551615ul>>&,std::span<std::byte_const,18446744073709551615ul>&,unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>&,unodb::detail::tree_depth<unodb::detail::basic_art_key<std::span<std::byte_const,18446744073709551615ul>>>&,unodb::optimistic_lock::read_critical_section&,unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>>*&,unodb::optimistic_lock::read_critical_section&,std::unique_ptr<unodb::detail::basic_leaf<std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_node_header>,unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>>&>
                       ((olc_inode_48<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
                         *)this,args,args_1,args_2,args_3,args_4,args_5,args_6,args_7,args_8);
    local_18 = _Var1._M_payload.
               super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
               ._M_engaged;
    break;
  case I256:
    _Var1._M_payload.
    super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
         = (_Optional_payload<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true,_true>
            )olc_inode_256<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
             ::
             add_or_choose_subtree<std::byte,unodb::detail::basic_art_key<std::span<std::byte_const,18446744073709551615ul>>&,std::span<std::byte_const,18446744073709551615ul>&,unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>&,unodb::detail::tree_depth<unodb::detail::basic_art_key<std::span<std::byte_const,18446744073709551615ul>>>&,unodb::optimistic_lock::read_critical_section&,unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>>*&,unodb::optimistic_lock::read_critical_section&,std::unique_ptr<unodb::detail::basic_leaf<std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_node_header>,unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>>&>
                       ((olc_inode_256<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
                         *)this,args,args_1,args_2,args_3,args_4,args_5,args_6,args_7,args_8);
    local_18 = _Var1._M_payload.
               super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
               ._M_engaged;
    break;
  default:
    cannot_happen("/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x368,"add_or_choose_subtree");
  }
  this_local = _Var1._M_payload.
               super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
               ._M_payload;
  oVar2.
  super__Optional_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true>
  ._M_payload.
  super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
  ._9_7_ = _Var1._M_payload.
           super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
           ._9_7_;
  oVar2.
  super__Optional_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true>
  ._M_payload.
  super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
  ._M_engaged = (bool)local_18;
  oVar2.
  super__Optional_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true>
  ._M_payload.
  super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
  ._M_payload._M_value =
       (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *)
       this_local;
  return (optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
          )oVar2.
           super__Optional_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true>
           ._M_payload.
           super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
  ;
}

Assistant:

[[nodiscard]] ReturnType add_or_choose_subtree(node_type type,
                                                 Args &&...args) {
    switch (type) {
      case node_type::I4:
        return static_cast<inode4_type *>(this)->add_or_choose_subtree(
            std::forward<Args>(args)...);
      case node_type::I16:
        return static_cast<inode16_type *>(this)->add_or_choose_subtree(
            std::forward<Args>(args)...);
      case node_type::I48:
        return static_cast<inode48_type *>(this)->add_or_choose_subtree(
            std::forward<Args>(args)...);
      case node_type::I256:
        return static_cast<inode256_type *>(this)->add_or_choose_subtree(
            std::forward<Args>(args)...);
        // LCOV_EXCL_START
      case node_type::LEAF:
        UNODB_DETAIL_CANNOT_HAPPEN();
    }
    UNODB_DETAIL_CANNOT_HAPPEN();
    // LCOV_EXCL_STOP
  }